

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

int ImStb::STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState *obj,int idx)

{
  uint uVar1;
  unsigned_short *puVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = obj->CurLenW;
  uVar4 = idx + 1U;
  if ((int)(idx + 1U) < (int)uVar1) {
    uVar4 = uVar1;
  }
  do {
    do {
      uVar5 = idx;
      idx = uVar5 + 1;
      uVar6 = uVar4;
      if ((int)uVar1 <= idx) goto LAB_001f2120;
    } while ((obj->Flags & 0x8000) != 0);
    uVar6 = idx;
    if ((int)uVar5 < 0) break;
    puVar2 = (obj->TextW).Data;
    bVar3 = is_separator((uint)puVar2[(ulong)(uint)idx - 1]);
  } while ((bVar3) || (bVar3 = is_separator((uint)puVar2[(uint)idx]), !bVar3));
LAB_001f2120:
  if ((int)uVar6 < (int)uVar1) {
    uVar1 = uVar6;
  }
  return uVar1;
}

Assistant:

static int  STB_TEXTEDIT_MOVEWORDRIGHT_MAC(ImGuiInputTextState* obj, int idx)   { idx++; int len = obj->CurLenW; while (idx < len && !is_word_boundary_from_left(obj, idx)) idx++; return idx > len ? len : idx; }